

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

PsbtSignatureDataStruct * __thiscall
cfd::api::json::PsbtSignatureData::ConvertToStruct(PsbtSignatureData *this)

{
  PsbtSignatureDataStruct *in_RSI;
  PsbtSignatureDataStruct *in_RDI;
  PsbtSignatureDataStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  PsbtSignatureDataStruct *this_00;
  
  this_00 = in_RDI;
  PsbtSignatureDataStruct::PsbtSignatureDataStruct(in_RSI);
  std::__cxx11::string::operator=
            ((string *)in_RDI,(string *)((in_RSI->signature).field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&in_RDI->signature,
             (string *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

PsbtSignatureDataStruct PsbtSignatureData::ConvertToStruct() const {  // NOLINT
  PsbtSignatureDataStruct result;
  result.pubkey = pubkey_;
  result.signature = signature_;
  result.ignore_items = ignore_items;
  return result;
}